

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O0

void OCTET_STRING_free(asn_TYPE_descriptor_t *td,void *sptr,int contents_only)

{
  int iVar1;
  long *__ptr;
  void *__ptr_00;
  int in_EDX;
  long *in_RSI;
  undefined8 *in_RDI;
  _stack_el *sel;
  _stack *stck;
  asn_struct_ctx_t *ctx;
  asn_OCTET_STRING_specifics_t *specs;
  OCTET_STRING_t *st;
  asn_OCTET_STRING_specifics_t *local_48;
  
  if ((in_RDI != (undefined8 *)0x0) && (in_RSI != (long *)0x0)) {
    if (in_RDI[0x13] == 0) {
      local_48 = &asn_DEF_OCTET_STRING_specs;
    }
    else {
      local_48 = (asn_OCTET_STRING_specifics_t *)in_RDI[0x13];
    }
    iVar1 = local_48->ctx_offset;
    ASN_DEBUG("Freeing %s as OCTET STRING",*in_RDI);
    if (*in_RSI != 0) {
      free((void *)*in_RSI);
      *in_RSI = 0;
    }
    __ptr = *(long **)((long)in_RSI + (long)iVar1 + 8);
    if (__ptr != (long *)0x0) {
      while (*__ptr != 0) {
        __ptr_00 = (void *)*__ptr;
        *__ptr = *(long *)((long)__ptr_00 + 0x20);
        free(__ptr_00);
      }
      free(__ptr);
    }
    if (in_EDX == 0) {
      free(in_RSI);
    }
  }
  return;
}

Assistant:

void
OCTET_STRING_free(asn_TYPE_descriptor_t *td, void *sptr, int contents_only) {
	OCTET_STRING_t *st = (OCTET_STRING_t *)sptr;
	asn_OCTET_STRING_specifics_t *specs;
	asn_struct_ctx_t *ctx;
	struct _stack *stck;

	if(!td || !st)
		return;

	specs = td->specifics
		    ? (asn_OCTET_STRING_specifics_t *)td->specifics
		    : &asn_DEF_OCTET_STRING_specs;
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);

	ASN_DEBUG("Freeing %s as OCTET STRING", td->name);

	if(st->buf) {
		FREEMEM(st->buf);
		st->buf = 0;
	}

	/*
	 * Remove decode-time stack.
	 */
	stck = (struct _stack *)ctx->ptr;
	if(stck) {
		while(stck->tail) {
			struct _stack_el *sel = stck->tail;
			stck->tail = sel->prev;
			FREEMEM(sel);
		}
		FREEMEM(stck);
	}

	if(!contents_only) {
		FREEMEM(st);
	}
}